

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2FullMatchN(void)

{
  bool bVar1;
  int i;
  Arg *args [2];
  StringPiece local_1f8;
  string s;
  Arg local_1c8;
  Arg local_1b8;
  LogMessageFatal local_1a0;
  
  args[1] = &local_1b8;
  local_1c8.arg_ = (void *)0x0;
  local_1c8.parser_ = RE2::Arg::parse_null;
  local_1b8.arg_ = (void *)0x0;
  local_1b8.parser_ = RE2::Arg::parse_null;
  args[0] = &local_1c8;
  s._M_dataplus._M_p = "hello";
  s._M_string_length = CONCAT44(s._M_string_length._4_4_,5);
  RE2::RE2((RE2 *)&local_1a0,"h.*o");
  bVar1 = RE2::FullMatchN((StringPiece *)&s,(RE2 *)&local_1a0,args,0);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2a9);
    std::operator<<((ostream *)&local_1a0.super_LogMessage.str_,
                    "Check failed: RE2::FullMatchN(\"hello\", \"h.*o\", args, 0)");
    LogMessageFatal::~LogMessageFatal(&local_1a0);
  }
  s._M_dataplus._M_p = "othello";
  s._M_string_length = CONCAT44(s._M_string_length._4_4_,7);
  RE2::RE2((RE2 *)&local_1a0,"h.*o");
  bVar1 = RE2::FullMatchN((StringPiece *)&s,(RE2 *)&local_1a0,args,0);
  RE2::~RE2((RE2 *)&local_1a0);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2aa);
    std::operator<<((ostream *)&local_1a0.super_LogMessage.str_,
                    "Check failed: !(RE2::FullMatchN(\"othello\", \"h.*o\", args, 0))");
    LogMessageFatal::~LogMessageFatal(&local_1a0);
  }
  local_1c8.arg_ = &i;
  local_1c8.parser_ = RE2::Arg::parse_int;
  s._M_dataplus._M_p = "1001";
  s._M_string_length = CONCAT44(s._M_string_length._4_4_,4);
  RE2::RE2((RE2 *)&local_1a0,"(\\d+)");
  bVar1 = RE2::FullMatchN((StringPiece *)&s,(RE2 *)&local_1a0,args,1);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2af);
    std::operator<<((ostream *)&local_1a0.super_LogMessage.str_,
                    "Check failed: RE2::FullMatchN(\"1001\", \"(\\\\d+)\", args, 1)");
    LogMessageFatal::~LogMessageFatal(&local_1a0);
  }
  if (i != 0x3e9) {
    LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2b0);
    std::operator<<((ostream *)&local_1a0.super_LogMessage.str_,"Check failed: (1001) == (i)");
    LogMessageFatal::~LogMessageFatal(&local_1a0);
  }
  s._M_dataplus._M_p = "three";
  s._M_string_length = CONCAT44(s._M_string_length._4_4_,5);
  RE2::RE2((RE2 *)&local_1a0,"(\\d+)");
  bVar1 = RE2::FullMatchN((StringPiece *)&s,(RE2 *)&local_1a0,args,1);
  RE2::~RE2((RE2 *)&local_1a0);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2b1);
    std::operator<<((ostream *)&local_1a0.super_LogMessage.str_,
                    "Check failed: !(RE2::FullMatchN(\"three\", \"(\\\\d+)\", args, 1))");
    LogMessageFatal::~LogMessageFatal(&local_1a0);
  }
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  local_1b8.parser_ = RE2::Arg::parse_string;
  local_1f8.ptr_ = "42:life";
  local_1f8.length_ = 7;
  local_1b8.arg_ = &s;
  RE2::RE2((RE2 *)&local_1a0,"(\\d+):(\\w+)");
  bVar1 = RE2::FullMatchN(&local_1f8,(RE2 *)&local_1a0,args,2);
  RE2::~RE2((RE2 *)&local_1a0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2b6);
    std::operator<<((ostream *)&local_1a0.super_LogMessage.str_,
                    "Check failed: RE2::FullMatchN(\"42:life\", \"(\\\\d+):(\\\\w+)\", args, 2)");
    LogMessageFatal::~LogMessageFatal(&local_1a0);
  }
  if (i != 0x2a) {
    LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2b7);
    std::operator<<((ostream *)&local_1a0.super_LogMessage.str_,"Check failed: (42) == (i)");
    LogMessageFatal::~LogMessageFatal(&local_1a0);
  }
  bVar1 = std::operator==("life",&s);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2b8);
    std::operator<<((ostream *)&local_1a0.super_LogMessage.str_,"Check failed: (\"life\") == (s)");
    LogMessageFatal::~LogMessageFatal(&local_1a0);
  }
  local_1f8.ptr_ = "hi1";
  local_1f8.length_ = 3;
  RE2::RE2((RE2 *)&local_1a0,"(\\w+)(1)");
  bVar1 = RE2::FullMatchN(&local_1f8,(RE2 *)&local_1a0,args,2);
  RE2::~RE2((RE2 *)&local_1a0);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x2b9);
    std::operator<<((ostream *)&local_1a0.super_LogMessage.str_,
                    "Check failed: !(RE2::FullMatchN(\"hi1\", \"(\\\\w+)(1)\", args, 2))");
    LogMessageFatal::~LogMessageFatal(&local_1a0);
  }
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

TEST(RE2, FullMatchN) {
  RE2::Arg argv[2];
  const RE2::Arg* const args[2] = { &argv[0], &argv[1] };

  // 0 arg
  EXPECT_TRUE(RE2::FullMatchN("hello", "h.*o", args, 0));
  EXPECT_FALSE(RE2::FullMatchN("othello", "h.*o", args, 0));

  // 1 arg
  int i;
  argv[0] = &i;
  EXPECT_TRUE(RE2::FullMatchN("1001", "(\\d+)", args, 1));
  EXPECT_EQ(1001, i);
  EXPECT_FALSE(RE2::FullMatchN("three", "(\\d+)", args, 1));

  // Multi-arg
  string s;
  argv[1] = &s;
  EXPECT_TRUE(RE2::FullMatchN("42:life", "(\\d+):(\\w+)", args, 2));
  EXPECT_EQ(42, i);
  EXPECT_EQ("life", s);
  EXPECT_FALSE(RE2::FullMatchN("hi1", "(\\w+)(1)", args, 2));
}